

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

LValue * __thiscall
slang::ast::RangeSelectExpression::evalLValueImpl(RangeSelectExpression *this,EvalContext *context)

{
  ConstantRange range_00;
  bool bVar1;
  undefined1 uVar2;
  Type *this_00;
  ConstantRange in_RSI;
  LValue *in_RDI;
  optional<slang::ConstantRange> range;
  bool in_stack_000000df;
  ConstantValue *in_stack_000000e0;
  EvalContext *in_stack_000000e8;
  RangeSelectExpression *in_stack_000000f0;
  ConstantValue loadedVal;
  LValue lval;
  LValue *in_stack_fffffffffffffd28;
  EvalContext *in_stack_fffffffffffffd30;
  Expression *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  LValue *this_01;
  LValue *in_stack_fffffffffffffed8;
  
  this_01 = in_RDI;
  value((RangeSelectExpression *)in_RSI);
  Expression::evalLValue(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  bVar1 = LValue::operator_cast_to_bool((LValue *)0xbe8965);
  if (bVar1) {
    slang::ConstantValue::ConstantValue((ConstantValue *)0xbe89bb);
    value((RangeSelectExpression *)in_RSI);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xbe89da);
    bVar1 = Type::hasFixedRange((Type *)in_stack_fffffffffffffd30);
    if (!bVar1) {
      LValue::load(in_stack_fffffffffffffed8);
      slang::ConstantValue::operator=
                ((ConstantValue *)in_stack_fffffffffffffd30,
                 (ConstantValue *)in_stack_fffffffffffffd28);
      slang::ConstantValue::~ConstantValue((ConstantValue *)0xbe8a34);
    }
    evalRange(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000df);
    bVar1 = std::optional::operator_cast_to_bool((optional<slang::ConstantRange> *)0xbe8ab9);
    if (bVar1) {
      value((RangeSelectExpression *)in_RSI);
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xbe8afc)
      ;
      uVar2 = Type::isIntegral((Type *)in_stack_fffffffffffffd30);
      if ((bool)uVar2) {
        std::optional<slang::ConstantRange>::operator*((optional<slang::ConstantRange> *)0xbe8b2a);
        range_00.right._3_1_ = uVar2;
        range_00._0_7_ = in_stack_fffffffffffffd40;
        LValue::addBitSlice((LValue *)in_stack_fffffffffffffd38,range_00);
      }
      else {
        std::optional<slang::ConstantRange>::operator*((optional<slang::ConstantRange> *)0xbe8b5e);
        this_00 = not_null<const_slang::ast::Type_*>::operator->
                            ((not_null<const_slang::ast::Type_*> *)0xbe8b77);
        in_stack_fffffffffffffd30 = (EvalContext *)Type::getArrayElementType(this_00);
        Type::getDefaultValue(this_00);
        LValue::addArraySlice(this_01,in_RSI,(ConstantValue *)in_RDI);
        slang::ConstantValue::~ConstantValue((ConstantValue *)0xbe8bcf);
      }
      LValue::LValue((LValue *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    }
    else {
      LValue::LValue((LValue *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    }
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xbe8c1e);
  }
  else {
    LValue::LValue((LValue *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  }
  LValue::~LValue((LValue *)0xbe8c3c);
  return this_01;
}

Assistant:

LValue RangeSelectExpression::evalLValueImpl(EvalContext& context) const {
    LValue lval = value().evalLValue(context);
    if (!lval)
        return nullptr;

    ConstantValue loadedVal;
    if (!value().type->hasFixedRange())
        loadedVal = lval.load();

    auto range = evalRange(context, loadedVal, /* enforceBounds */ false);
    if (!range)
        return nullptr;

    if (value().type->isIntegral())
        lval.addBitSlice(*range);
    else
        lval.addArraySlice(*range, type->getArrayElementType()->getDefaultValue());

    return lval;
}